

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

u64 HighsHashHelpers::modexp_M61(u64 a,u64 e)

{
  u64 a_00;
  
  a_00 = a;
  for (; e != 1; e = e >> 1) {
    a_00 = multiply_modM61(a_00,a_00);
    if ((e & 1) != 0) {
      a_00 = multiply_modM61(a_00,a);
    }
  }
  return a_00;
}

Assistant:

static u64 modexp_M61(u64 a, u64 e) {
    // the exponent need to be greater than zero
    assert(e > 0);
    u64 result = a;

    while (e != 1) {
      // square
      result = multiply_modM61(result, result);

      // multiply with a if exponent is odd
      if (e & 1) result = multiply_modM61(result, a);

      // shift to next bit
      e = e >> 1;
    }

    return result;
  }